

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

void karma(int ip,int iq,double *phi,double *theta,double *A,double *P,double *V,int N,double *W,
          double *resid,double *sumlog,double *ssq,int iupd,double delta,int *iter,int *nit)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  double *pdVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  *iter = 0;
  uVar9 = (ulong)(iq + 1U);
  if ((int)(iq + 1U) <= ip) {
    uVar9 = (ulong)(uint)ip;
  }
  if (*nit == 0) {
    if (0 < N) {
      iVar3 = (int)uVar9;
      uVar11 = iVar3 - 1;
      pdVar1 = P + 1;
      uVar14 = 0;
      do {
        dVar18 = W[uVar14];
        if (iupd == 1 && uVar14 == 0) {
LAB_00112a9d:
          dVar19 = ABS(*P);
          dVar20 = dVar18 - *A;
          if (1 < iVar3) {
            uVar5 = 1;
            pdVar10 = pdVar1;
            uVar12 = uVar9;
            uVar7 = uVar9;
            do {
              uVar7 = uVar7 - 1;
              dVar2 = P[uVar5];
              A[uVar5] = (dVar2 / dVar19) * dVar20 + A[uVar5];
              iVar4 = (int)uVar12;
              uVar12 = 0;
              do {
                P[(long)iVar4 + uVar12] =
                     pdVar10[uVar12] * -(dVar2 / dVar19) + P[(long)iVar4 + uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar7 != uVar12);
              uVar12 = (ulong)(uint)(iVar4 + (int)uVar12);
              uVar5 = uVar5 + 1;
              pdVar10 = pdVar10 + 1;
            } while (uVar5 != uVar9);
          }
          *A = dVar18;
          if (0 < iVar3) {
            memset(P,0,uVar9 * 8);
          }
        }
        else {
          dVar19 = *A;
          if (1 < iVar3) {
            memmove(A,A + 1,(ulong)uVar11 * 8);
          }
          A[(int)uVar11] = 0.0;
          if (0 < ip) {
            uVar7 = 0;
            do {
              A[uVar7] = phi[uVar7] * dVar19 + A[uVar7];
              uVar7 = uVar7 + 1;
            } while ((uint)ip != uVar7);
          }
          if (0 < iVar3) {
            iVar4 = 0;
            iVar6 = -1;
            uVar7 = uVar9;
            uVar12 = (ulong)uVar11;
            uVar13 = uVar11;
            uVar8 = uVar11;
            do {
              lVar15 = (long)iVar6;
              lVar16 = 0;
              do {
                dVar19 = V[lVar15 + lVar16 + 1];
                pdVar1[lVar15 + lVar16] = dVar19;
                if ((int)uVar12 != (int)lVar16) {
                  lVar17 = (long)(int)uVar13;
                  uVar13 = uVar13 + 1;
                  pdVar1[lVar15 + lVar16] = dVar19 + P[lVar17 + 1];
                }
                lVar16 = lVar16 + 1;
              } while ((int)uVar8 - lVar15 != lVar16);
              iVar4 = iVar4 + 1;
              uVar8 = uVar8 + (int)uVar12;
              uVar12 = uVar12 - 1;
              iVar6 = iVar6 + (int)uVar7;
              uVar7 = (ulong)((int)uVar7 - 1);
            } while (iVar4 != iVar3);
            goto LAB_00112a9d;
          }
          dVar19 = ABS(*P);
          dVar20 = dVar18 - *A;
          *A = dVar18;
        }
        resid[uVar14] = dVar20 / SQRT(dVar19);
        *ssq = (dVar20 * dVar20) / dVar19 + *ssq;
        dVar18 = log(dVar19);
        *sumlog = dVar18 + *sumlog;
        *iter = *iter + 1;
        uVar14 = uVar14 + 1;
      } while (uVar14 != (uint)N);
    }
    *nit = N;
    iVar3 = *iter;
  }
  else {
    *nit = 0;
    iVar3 = *iter;
    if (0 < N) {
      uVar11 = 0xffffffff;
      uVar9 = 0;
      do {
        dVar18 = W[uVar9];
        if (0 < ip) {
          uVar14 = 0;
          uVar13 = uVar11;
          do {
            if (0 < (int)(uVar13 + 1)) {
              dVar18 = dVar18 - phi[uVar14] * W[uVar13];
            }
            uVar14 = uVar14 + 1;
            uVar13 = uVar13 - 1;
          } while ((uint)ip != uVar14);
        }
        if (0 < iq) {
          do {
          } while( true );
        }
        resid[uVar9] = dVar18;
        *ssq = dVar18 * dVar18 + *ssq;
        uVar9 = uVar9 + 1;
        uVar11 = uVar11 + 1;
      } while (uVar9 != (uint)N);
      iVar3 = iVar3 + N;
      *iter = iVar3;
    }
  }
  if (iVar3 == 0) {
    *iter = 1;
  }
  return;
}

Assistant:

void karma(int ip,int iq,double *phi,double *theta,double *A,double *P,double*V,int N,
	double *W,double *resid,double *sumlog,double *ssq,int iupd,double delta,int *iter,int *nit) {
	int ir,np,i,j,ir1,inde,swtch,ind,indn,l,ii,indw;
	double wnext,dt,A1,ft,ut,g,et;
	double *E;

	ir = iq + 1;
	swtch = 0;
	*iter = 0;

	if (ir < ip) {
		ir = ip;
	}
	E = (double*)malloc(sizeof(double)* ir);
	np = (ir * (ir + 1)) / 2;

	ir1 = ir - 1;
	for (i = 0; i < ir; ++i) {
		E[i] = 0.0;
	}
	inde = 0;

	if (*nit == 0) {
		for (i = 0; i < N; ++i) {//500
			wnext = W[i];
			if (iupd != 1 || i > 0) {//300
				dt = 0.0;
				if (ir != 1) {
					dt = P[ir];
				}
				/*
				if (dt < delta) {
					swtch = 1;
					*nit = i + 1;
					break;//610
				}
				*/
				A1 = A[0];
				if (ir != 1) {//110
					for (j = 0; j < ir1; ++j) {
						A[j] = A[j + 1];
					}
				}//110
				A[ir - 1] = 0.0;
				if (ip != 0) {//200
					for (j = 0; j < ip; ++j) {
						A[j] += phi[j] * A1;
					}
				}//200
				ind = -1;
				indn = ir-1;
				for (l = 0; l < ir; ++l) {
					for (j = l; j < ir; ++j) {
						ind++;
						P[ind] = V[ind];
						if (j != (ir - 1)) {
							indn++;
							P[ind] += P[indn];
						}
					}
				}
			}//300
			ft = fabs(P[0]);//modification
			ut = wnext - A[0];
			if (ir != 1) {//410
				ind = ir;
				for (j = 1; j < ir; ++j) {
					g = P[j] / ft;
					A[j] += g*ut;
					for (l = j; l < ir; ++l) {
						P[ind] -= g*P[l];
						ind++;
					}
				}
			}//410
			A[0] = wnext;
			for (l = 0; l < ir; ++l) {
				P[l] = 0.0;
			}
			resid[i] = ut / sqrt(ft);
			E[inde] = resid[i];
			inde++;
			if (inde >= iq) {
				inde = 0;
			}
			*ssq += (ut*ut) / ft;
			*sumlog += log(ft);// alog
			*iter = *iter + 1;;
			//printf(" sl %g", *sumlog);


		}//500
		if (swtch == 0) {
			*nit = N;
		}
	}
	else {
		i = 0;
		*nit = i;
		for (ii = i; ii < N; ++ii) {//650
			et = W[ii];
			indw = ii;
			if (ip != 0) {//630
				for (j = 0; j < ip; ++j) {
					indw--;
					if (indw >= 0) {
						et -= phi[j] * W[indw];
					}
				}
			}//630
			if (iq != 0) {//645
				for (j = 0; j < iq; ++i) {
					inde--;
					if (inde == -1) {
						inde = iq-1;
					}
					et -= theta[j] * E[inde];
				}
			}//645
			E[inde] = et;
			resid[ii] = et;
			*ssq += et*et;
			*iter = *iter + 1;
			inde++;
			if (inde >= iq) {
				inde = 0;
			}
		}//650

	}
	if (*iter == 0) {
		*iter = 1;
	}
	free(E);
}